

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging_unittest.cc
# Opt level: O2

void TestLogging(bool check_counts)

{
  uint uVar1;
  _func_int **pp_Var2;
  _func_int *p_Var3;
  int64 iVar4;
  int64 iVar5;
  int64 iVar6;
  ostream *poVar7;
  uint *puVar8;
  LogMessageData *pLVar9;
  uint uVar10;
  undefined7 in_register_00000039;
  SendMethod in_R9;
  uint uVar11;
  LogMessage local_a0;
  LogMessage outer;
  allocator<char> local_6d;
  undefined4 local_6c;
  char s [6];
  char const_s [12];
  
  local_6c = (undefined4)CONCAT71(in_register_00000039,check_counts);
  iVar4 = google::LogMessage::num_messages(0);
  iVar5 = google::LogMessage::num_messages(1);
  iVar6 = google::LogMessage::num_messages(2);
  google::LogMessage::LogMessage
            (&local_a0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
             ,0xf7);
  poVar7 = google::LogMessage::stream(&local_a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&outer,"foo ",(allocator<char> *)const_s);
  poVar7 = std::operator<<(poVar7,(string *)&outer);
  poVar7 = std::operator<<(poVar7,"bar ");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,10);
  std::operator<<(poVar7,' ');
  std::ostream::_M_insert<double>(3.4);
  std::__cxx11::string::~string((string *)&outer);
  google::LogMessage::~LogMessage(&local_a0);
  puVar8 = (uint *)__errno_location();
  for (uVar11 = 0; uVar11 != 10; uVar11 = uVar11 + 1) {
    uVar1 = *puVar8;
    *puVar8 = uVar11;
    TestLogging::occurrences_251 = TestLogging::occurrences_251 + 1;
    TestLogging::occurrences_mod_n_251 =
         TestLogging::occurrences_mod_n_251 + (uint)(TestLogging::occurrences_mod_n_251 < 2) * 2 +
         -1;
    if (TestLogging::occurrences_mod_n_251 == 1) {
      local_a0.allocated_ = (LogMessageData *)google::LogMessage::SendToLog;
      local_a0.data_ = (LogMessageData *)0x0;
      google::ErrnoLogMessage::ErrnoLogMessage
                ((ErrnoLogMessage *)&outer,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                 ,0xfb,2,TestLogging::occurrences_251,in_R9);
      poVar7 = google::LogMessage::stream(&outer);
      poVar7 = std::operator<<(poVar7,"Plog every 2, iteration ");
      local_a0.allocated_ = (LogMessageData *)((ulong)local_a0.allocated_ & 0xffffffff00000000);
      google::operator<<(poVar7,(PRIVATE_Counter *)&local_a0);
      google::ErrnoLogMessage::~ErrnoLogMessage((ErrnoLogMessage *)&outer);
    }
    *puVar8 = uVar1;
    TestLogging::occurrences_254 = TestLogging::occurrences_254 + 1;
    TestLogging::occurrences_mod_n_254 =
         TestLogging::occurrences_mod_n_254 + (uint)(TestLogging::occurrences_mod_n_254 < 3) * 3 +
         -2;
    if (TestLogging::occurrences_mod_n_254 == 1) {
      local_a0.allocated_ = (LogMessageData *)google::LogMessage::SendToLog;
      local_a0.data_ = (LogMessageData *)0x0;
      google::LogMessage::LogMessage
                (&outer,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                 ,0xfe,2,TestLogging::occurrences_254,in_R9);
      poVar7 = google::LogMessage::stream(&outer);
      poVar7 = std::operator<<(poVar7,"Log every 3, iteration ");
      local_a0.allocated_ = (LogMessageData *)((ulong)local_a0.allocated_ & 0xffffffff00000000);
      poVar7 = google::operator<<(poVar7,(PRIVATE_Counter *)&local_a0);
      std::endl<char,std::char_traits<char>>(poVar7);
      google::LogMessage::~LogMessage(&outer);
    }
    TestLogging::occurrences_255 = TestLogging::occurrences_255 + 1;
    TestLogging::occurrences_mod_n_255 =
         TestLogging::occurrences_mod_n_255 + (uint)(TestLogging::occurrences_mod_n_255 < 4) * 4 +
         -3;
    if (TestLogging::occurrences_mod_n_255 == 1) {
      local_a0.allocated_ = (LogMessageData *)google::LogMessage::SendToLog;
      local_a0.data_ = (LogMessageData *)0x0;
      google::LogMessage::LogMessage
                (&outer,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                 ,0xff,2,TestLogging::occurrences_255,in_R9);
      poVar7 = google::LogMessage::stream(&outer);
      poVar7 = std::operator<<(poVar7,"Log every 4, iteration ");
      local_a0.allocated_ = (LogMessageData *)((ulong)local_a0.allocated_ & 0xffffffff00000000);
      poVar7 = google::operator<<(poVar7,(PRIVATE_Counter *)&local_a0);
      std::endl<char,std::char_traits<char>>(poVar7);
      google::LogMessage::~LogMessage(&outer);
    }
    TestLogging::occurrences_257 = TestLogging::occurrences_257 + 1;
    TestLogging::occurrences_mod_n_257 = (TestLogging::occurrences_mod_n_257 + 1U) % 5;
    if (TestLogging::occurrences_mod_n_257 == 1) {
      local_a0.allocated_ = (LogMessageData *)google::LogMessage::SendToLog;
      local_a0.data_ = (LogMessageData *)0x0;
      google::LogMessage::LogMessage
                (&outer,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                 ,0x101,1,TestLogging::occurrences_257,in_R9);
      poVar7 = google::LogMessage::stream(&outer);
      poVar7 = std::operator<<(poVar7,"Log if every 5, iteration ");
      local_a0.allocated_ = (LogMessageData *)((ulong)local_a0.allocated_ & 0xffffffff00000000);
      google::operator<<(poVar7,(PRIVATE_Counter *)&local_a0);
      google::LogMessage::~LogMessage(&outer);
    }
    TestLogging::occurrences_258 = TestLogging::occurrences_258 + 1;
    TestLogging::occurrences_260 = TestLogging::occurrences_260 + 1;
    local_a0.allocated_ = (LogMessageData *)google::LogMessage::SendToLog;
    local_a0.data_ = (LogMessageData *)0x0;
    google::LogMessage::LogMessage
              (&outer,
               "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
               ,0x104,0,TestLogging::occurrences_260,in_R9);
    poVar7 = google::LogMessage::stream(&outer);
    poVar7 = std::operator<<(poVar7,"Log if every 1, iteration ");
    local_a0.allocated_ = (LogMessageData *)((ulong)local_a0.allocated_ & 0xffffffff00000000);
    google::operator<<(poVar7,(PRIVATE_Counter *)&local_a0);
    google::LogMessage::~LogMessage(&outer);
    TestLogging::occurrences_261 = TestLogging::occurrences_261 + 1;
    if ((uVar11 < 3) &&
       (uVar10 = ~TestLogging::occurrences_mod_n_261, uVar1 = TestLogging::occurrences_mod_n_261 & 1
       , TestLogging::occurrences_mod_n_261 = uVar10 & 1, uVar1 == 0)) {
      local_a0.allocated_ = (LogMessageData *)google::LogMessage::SendToLog;
      local_a0.data_ = (LogMessageData *)0x0;
      google::LogMessage::LogMessage
                (&outer,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                 ,0x105,2,TestLogging::occurrences_261,in_R9);
      poVar7 = google::LogMessage::stream(&outer);
      poVar7 = std::operator<<(poVar7,"Log if less than 3 every 2, iteration ");
      local_a0.allocated_ = (LogMessageData *)((ulong)local_a0.allocated_ & 0xffffffff00000000);
      google::operator<<(poVar7,(PRIVATE_Counter *)&local_a0);
      google::LogMessage::~LogMessage(&outer);
    }
  }
  google::LogMessage::LogMessage
            (&outer,
             "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
             ,0x108,1);
  poVar7 = google::LogMessage::stream(&outer);
  std::operator<<(poVar7,"log_if this");
  google::LogMessage::~LogMessage(&outer);
  builtin_strncpy(s,"array",6);
  google::LogMessage::LogMessage
            (&outer,
             "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
             ,0x10c);
  poVar7 = google::LogMessage::stream(&outer);
  std::operator<<(poVar7,s);
  google::LogMessage::~LogMessage(&outer);
  builtin_strncpy(const_s,"const array",0xc);
  google::LogMessage::LogMessage
            (&outer,
             "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
             ,0x10e);
  poVar7 = google::LogMessage::stream(&outer);
  std::operator<<(poVar7,const_s);
  google::LogMessage::~LogMessage(&outer);
  google::LogMessage::LogMessage
            (&local_a0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
             ,0x110,2);
  poVar7 = google::LogMessage::stream(&local_a0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&outer,"foo",&local_6d);
  poVar7 = std::operator<<(poVar7,(string *)&outer);
  poVar7 = std::operator<<(poVar7,' ');
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,1000);
  poVar7 = std::operator<<(poVar7,' ');
  *(undefined8 *)(&poVar7->field_0x10 + (long)poVar7->_vptr_basic_ostream[-3]) = 10;
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,1000);
  poVar7 = std::operator<<(poVar7," ");
  pp_Var2 = poVar7->_vptr_basic_ostream;
  *(undefined8 *)(&poVar7->field_0x10 + (long)pp_Var2[-3]) = 1;
  p_Var3 = pp_Var2[-3];
  *(uint *)(&poVar7->field_0x18 + (long)p_Var3) =
       *(uint *)(&poVar7->field_0x18 + (long)p_Var3) & 0xffffffb5 | 8;
  std::ostream::operator<<(poVar7,1000);
  std::__cxx11::string::~string((string *)&outer);
  google::LogMessage::~LogMessage(&local_a0);
  google::LogMessage::LogMessage
            (&outer,
             "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
             ,0x114,2);
  poVar7 = google::LogMessage::stream(&outer);
  std::operator<<(poVar7,"outer");
  google::LogMessage::LogMessage
            (&local_a0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
             ,0x117,2);
  poVar7 = google::LogMessage::stream(&local_a0);
  std::operator<<(poVar7,"inner");
  google::LogMessage::~LogMessage(&local_a0);
  google::LogMessage::~LogMessage(&outer);
  google::LogMessage::LogMessage(&outer,"foo",-1,0);
  poVar7 = google::LogMessage::stream(&outer);
  std::operator<<(poVar7,"no prefix");
  google::LogMessage::~LogMessage(&outer);
  if ((char)local_6c == '\0') {
    return;
  }
  outer.allocated_ = (LogMessageData *)(iVar4 + 0xe);
  local_a0.allocated_ = (LogMessageData *)google::LogMessage::num_messages(0);
  pLVar9 = (LogMessageData *)
           google::Check_EQImpl<long,long>
                     ((long *)&outer,(long *)&local_a0,
                      "base_num_infos + 14 == LogMessage::num_messages(GLOG_INFO)");
  if (pLVar9 == (LogMessageData *)0x0) {
    outer.allocated_ = (LogMessageData *)(iVar5 + 3);
    local_a0.allocated_ = (LogMessageData *)google::LogMessage::num_messages(1);
    pLVar9 = (LogMessageData *)
             google::Check_EQImpl<long,long>
                       ((long *)&outer,(long *)&local_a0,
                        "base_num_warning + 3 == LogMessage::num_messages(GLOG_WARNING)");
    if (pLVar9 == (LogMessageData *)0x0) {
      outer.allocated_ = (LogMessageData *)(iVar6 + 0x11);
      local_a0.allocated_ = (LogMessageData *)google::LogMessage::num_messages(2);
      local_a0.allocated_ =
           (LogMessageData *)
           google::Check_EQImpl<long,long>
                     ((long *)&outer,(long *)&local_a0,
                      "base_num_errors + 17 == LogMessage::num_messages(GLOG_ERROR)");
      if (local_a0.allocated_ == (LogMessageData *)0x0) {
        return;
      }
      google::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&outer,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                 ,0x11f,(CheckOpString *)&local_a0);
      google::LogMessage::stream(&outer);
    }
    else {
      local_a0.allocated_ = pLVar9;
      google::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&outer,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                 ,0x11e,(CheckOpString *)&local_a0);
      google::LogMessage::stream(&outer);
    }
  }
  else {
    local_a0.allocated_ = pLVar9;
    google::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&outer,
               "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
               ,0x11d,(CheckOpString *)&local_a0);
    google::LogMessage::stream(&outer);
  }
  google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&outer);
}

Assistant:

void TestLogging(bool check_counts) {
  int64 base_num_infos   = LogMessage::num_messages(GLOG_INFO);
  int64 base_num_warning = LogMessage::num_messages(GLOG_WARNING);
  int64 base_num_errors  = LogMessage::num_messages(GLOG_ERROR);

  LOG(INFO) << string("foo ") << "bar " << 10 << ' ' << 3.4;
  for ( int i = 0; i < 10; ++i ) {
    int old_errno = errno;
    errno = i;
    PLOG_EVERY_N(ERROR, 2) << "Plog every 2, iteration " << COUNTER;
    errno = old_errno;

    LOG_EVERY_N(ERROR, 3) << "Log every 3, iteration " << COUNTER << endl;
    LOG_EVERY_N(ERROR, 4) << "Log every 4, iteration " << COUNTER << endl;

    LOG_IF_EVERY_N(WARNING, true, 5) << "Log if every 5, iteration " << COUNTER;
    LOG_IF_EVERY_N(WARNING, false, 3)
        << "Log if every 3, iteration " << COUNTER;
    LOG_IF_EVERY_N(INFO, true, 1) << "Log if every 1, iteration " << COUNTER;
    LOG_IF_EVERY_N(ERROR, (i < 3), 2)
        << "Log if less than 3 every 2, iteration " << COUNTER;
  }
  LOG_IF(WARNING, true) << "log_if this";
  LOG_IF(WARNING, false) << "don't log_if this";

  char s[] = "array";
  LOG(INFO) << s;
  const char const_s[] = "const array";
  LOG(INFO) << const_s;
  int j = 1000;
  LOG(ERROR) << string("foo") << ' '<< j << ' ' << setw(10) << j << " "
             << setw(1) << hex << j;

  {
    google::LogMessage outer(__FILE__, __LINE__, GLOG_ERROR);
    outer.stream() << "outer";

    LOG(ERROR) << "inner";
  }

  LogMessage("foo", LogMessage::kNoLogPrefix, GLOG_INFO).stream() << "no prefix";

  if (check_counts) {
    CHECK_EQ(base_num_infos   + 14, LogMessage::num_messages(GLOG_INFO));
    CHECK_EQ(base_num_warning + 3,  LogMessage::num_messages(GLOG_WARNING));
    CHECK_EQ(base_num_errors  + 17, LogMessage::num_messages(GLOG_ERROR));
  }
}